

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O0

void cleanEncryption(QPDF *q)

{
  byte bVar1;
  bool bVar2;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  uint local_68;
  allocator<char> local_51;
  string local_50 [32];
  QPDFObjectHandle local_30;
  undefined1 local_20 [8];
  QPDFObjectHandle enc;
  QPDF *q_local;
  
  enc.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)q;
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"/Encrypt",&local_51);
  QPDFObjectHandle::getKey((string *)local_20);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  bVar1 = QPDFObjectHandle::isDictionary();
  bVar2 = (bVar1 & 1) != 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_88,"/O",&local_89);
    QPDFObjectHandle::removeKey((string *)local_20);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"/OE",&local_b1);
    QPDFObjectHandle::removeKey((string *)local_20);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d8,"/U",&local_d9);
    QPDFObjectHandle::removeKey((string *)local_20);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_100,"/UE",&local_101);
    QPDFObjectHandle::removeKey((string *)local_20);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_128,"/Perms",&local_129);
    QPDFObjectHandle::removeKey((string *)local_20);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
  }
  local_68 = (uint)!bVar2;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_20);
  return;
}

Assistant:

void
cleanEncryption(QPDF& q)
{
    auto enc = q.getTrailer().getKey("/Encrypt");
    if (!enc.isDictionary()) {
        return;
    }
    enc.removeKey("/O");
    enc.removeKey("/OE");
    enc.removeKey("/U");
    enc.removeKey("/UE");
    enc.removeKey("/Perms");
}